

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie_swap.cpp
# Opt level: O2

int32_t utrie2_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                      UErrorCode *pErrorCode)

{
  uint uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((inData == (void *)0x0 || ds == (UDataSwapper *)0x0) ||
       (outData == (void *)0x0 && -1 < length)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (0xf < (uint)length) {
        uVar5 = (*ds->readUInt32)(*inData);
        uVar2 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 4));
        uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 6));
        uVar4 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 8));
        if ((uVar3 < 0x840 || ((uVar2 & 0xe) != 0 || uVar5 != 0x54726932)) || uVar4 < 0x30) {
          *pErrorCode = U_INVALID_FORMAT_ERROR;
          return 0;
        }
        iVar6 = (uint)uVar4 * 8;
        if ((uVar2 & 1) != 0) {
          iVar6 = (uint)uVar4 << 4;
        }
        uVar7 = iVar6 + (uint)uVar3 * 2 + 0x10;
        if (length < 0) {
          return uVar7;
        }
        if (uVar7 <= (uint)length) {
          uVar1 = (uint)uVar3 * 2;
          (*ds->swapArray32)(ds,inData,4,outData,pErrorCode);
          (*ds->swapArray16)(ds,(void *)((long)inData + 4),0xc,(void *)((long)outData + 4),
                             pErrorCode);
          pvVar8 = (void *)((long)inData + 0x10);
          if ((uVar2 & 1) != 0) {
            (*ds->swapArray16)(ds,pvVar8,uVar1,(void *)((long)outData + 0x10),pErrorCode);
            (*ds->swapArray32)(ds,(void *)((long)pvVar8 + (ulong)uVar1),(uint)uVar4 << 4,
                               (void *)((long)outData + (ulong)uVar1 + 0x10),pErrorCode);
            return uVar7;
          }
          (*ds->swapArray16)(ds,pvVar8,(uint)uVar4 * 8 + uVar1,(void *)((long)outData + 0x10),
                             pErrorCode);
          return uVar7;
        }
      }
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_swap(const UDataSwapper *ds,
            const void *inData, int32_t length, void *outData,
            UErrorCode *pErrorCode) {
    const UTrie2Header *inTrie;
    UTrie2Header trie;
    int32_t dataLength, size;
    UTrie2ValueBits valueBits;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || (length>=0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    if(length>=0 && length<(int32_t)sizeof(UTrie2Header)) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    inTrie=(const UTrie2Header *)inData;
    trie.signature=ds->readUInt32(inTrie->signature);
    trie.options=ds->readUInt16(inTrie->options);
    trie.indexLength=ds->readUInt16(inTrie->indexLength);
    trie.shiftedDataLength=ds->readUInt16(inTrie->shiftedDataLength);

    valueBits=(UTrie2ValueBits)(trie.options&UTRIE2_OPTIONS_VALUE_BITS_MASK);
    dataLength=(int32_t)trie.shiftedDataLength<<UTRIE2_INDEX_SHIFT;

    if( trie.signature!=UTRIE2_SIG ||
        valueBits<0 || UTRIE2_COUNT_VALUE_BITS<=valueBits ||
        trie.indexLength<UTRIE2_INDEX_1_OFFSET ||
        dataLength<UTRIE2_DATA_START_OFFSET
    ) {
        *pErrorCode=U_INVALID_FORMAT_ERROR; /* not a UTrie */
        return 0;
    }

    size=sizeof(UTrie2Header)+trie.indexLength*2;
    switch(valueBits) {
    case UTRIE2_16_VALUE_BITS:
        size+=dataLength*2;
        break;
    case UTRIE2_32_VALUE_BITS:
        size+=dataLength*4;
        break;
    default:
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    if(length>=0) {
        UTrie2Header *outTrie;

        if(length<size) {
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outTrie=(UTrie2Header *)outData;

        /* swap the header */
        ds->swapArray32(ds, &inTrie->signature, 4, &outTrie->signature, pErrorCode);
        ds->swapArray16(ds, &inTrie->options, 12, &outTrie->options, pErrorCode);

        /* swap the index and the data */
        switch(valueBits) {
        case UTRIE2_16_VALUE_BITS:
            ds->swapArray16(ds, inTrie+1, (trie.indexLength+dataLength)*2, outTrie+1, pErrorCode);
            break;
        case UTRIE2_32_VALUE_BITS:
            ds->swapArray16(ds, inTrie+1, trie.indexLength*2, outTrie+1, pErrorCode);
            ds->swapArray32(ds, (const uint16_t *)(inTrie+1)+trie.indexLength, dataLength*4,
                                     (uint16_t *)(outTrie+1)+trie.indexLength, pErrorCode);
            break;
        default:
            *pErrorCode=U_INVALID_FORMAT_ERROR;
            return 0;
        }
    }

    return size;
}